

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_math.c
# Opt level: O0

double swap_mse(float *im1,float *im2,size_t w,size_t h,size_t X1,size_t Y1,size_t X2,size_t Y2)

{
  long lVar1;
  undefined1 auVar2 [16];
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t n;
  size_t j;
  size_t i;
  double mse;
  double d;
  size_t Y1_local;
  size_t X1_local;
  size_t h_local;
  size_t w_local;
  float *im2_local;
  float *im1_local;
  
  mse = 0.0;
  n = 0;
  local_60 = w;
  if (X1 < w) {
    local_60 = X1;
  }
  local_68 = h;
  if (Y1 < h) {
    local_68 = Y1;
  }
  local_70 = w;
  if (X2 < w) {
    local_70 = X2;
  }
  local_78 = h;
  if (Y2 < h) {
    local_78 = Y2;
  }
  for (j = local_68; j < local_78; j = j + 1) {
    for (i = local_60; i < local_70; i = i + 1) {
      n = n + 1;
      lVar1 = j * w + i;
      auVar2._8_4_ = (int)(n >> 0x20);
      auVar2._0_8_ = n;
      auVar2._12_4_ = 0x45300000;
      mse = ((double)(im1[lVar1] - im2[lVar1]) * (double)(im1[lVar1] - im2[lVar1]) - mse) /
            ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) + mse;
    }
  }
  return mse;
}

Assistant:

double swap_mse(const float *im1, const float *im2, size_t w, size_t h,
                size_t X1, size_t Y1, size_t X2, size_t Y2) {
    double d, mse = 0;
    size_t i, j, n = 0;

    X1 = MIN(X1, w), Y1 = MIN(Y1, h), X2 = MIN(X2, w), Y2 = MIN(Y2, h);
    for (j = Y1; j < Y2; ++j)
        for (i = X1; i < X2; ++i) {
            ++n;
            d = im1[j * w + i] - im2[j * w + i];
            mse += (d * d - mse) / n;
        }

    return mse;
}